

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2shape_index.h
# Opt level: O0

bool __thiscall EncodedS2ShapeIndex::cell_decoded(EncodedS2ShapeIndex *this,int i)

{
  reference pvVar1;
  uint64 group_bits;
  int i_local;
  EncodedS2ShapeIndex *this_local;
  memory_order __b;
  
  pvVar1 = std::
           vector<std::atomic<unsigned_long_long>,_std::allocator<std::atomic<unsigned_long_long>_>_>
           ::operator[](&this->cells_decoded_,(long)(i >> 6));
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return ((pvVar1->super___atomic_base<unsigned_long_long>)._M_i & 1L << ((byte)i & 0x3f)) != 0;
}

Assistant:

inline bool EncodedS2ShapeIndex::cell_decoded(int i) const {
  uint64 group_bits = cells_decoded_[i >> 6].load(std::memory_order_relaxed);
  return (group_bits & (1ULL << (i & 63))) != 0;
}